

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

void helper_vmsumuhs_ppc(CPUPPCState_conflict *env,ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b,
                        ppc_avr_t *c)

{
  uint32_t uVar1;
  uint64_t t;
  int sat;
  int i;
  uint32_t prod [8];
  ppc_avr_t *c_local;
  ppc_avr_t *b_local;
  ppc_avr_t *a_local;
  ppc_avr_t *r_local;
  CPUPPCState_conflict *env_local;
  
  t._0_4_ = 0;
  for (t._4_4_ = 0; t._4_4_ < 8; t._4_4_ = t._4_4_ + 1) {
    (&sat)[(int)t._4_4_] = (uint)a->u16[(int)t._4_4_] * (uint)b->u16[(int)t._4_4_];
  }
  for (t._4_4_ = 3; -1 < (int)t._4_4_; t._4_4_ = t._4_4_ + -1) {
    uVar1 = cvtuduw((ulong)c->u32[(int)t._4_4_] + (ulong)(uint)(&sat)[(int)(t._4_4_ << 1)] +
                    (ulong)(uint)(&sat)[(int)(t._4_4_ * 2 + 1)],(int *)&t);
    r->u32[(int)t._4_4_] = uVar1;
  }
  if ((int)t != 0) {
    set_vscr_sat(env);
  }
  return;
}

Assistant:

void helper_vmsumuhs(CPUPPCState *env, ppc_avr_t *r, ppc_avr_t *a,
                     ppc_avr_t *b, ppc_avr_t *c)
{
    uint32_t prod[8];
    int i;
    int sat = 0;

    for (i = 0; i < ARRAY_SIZE(r->u16); i++) {
        prod[i] = a->u16[i] * b->u16[i];
    }

    VECTOR_FOR_INORDER_I(i, s32) {
        uint64_t t = (uint64_t)c->u32[i] + prod[2 * i] + prod[2 * i + 1];

        r->u32[i] = cvtuduw(t, &sat);
    }

    if (sat) {
        set_vscr_sat(env);
    }
}